

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  int *piVar6;
  float *pfVar7;
  long lVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  ulong uVar28;
  void *pvVar29;
  size_type __n;
  long lVar30;
  void *pvVar31;
  undefined4 uVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  int size;
  int size_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_1f0;
  void *local_1e0;
  allocator_type local_1c9;
  ulong local_1c8;
  ulong local_1c0;
  void *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  void *local_1a0;
  Mat local_198;
  Mat *local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  undefined1 local_128 [16];
  ulong local_118;
  ulong local_110;
  void *local_108;
  long local_100;
  long local_f8;
  void *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Option *local_b8;
  void *local_b0;
  ulong local_a8;
  void *local_a0;
  long local_98;
  void *local_90;
  long local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  long local_68;
  void *local_60;
  long local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar23 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  local_d8._8_8_ = local_d8._0_8_;
  local_d8._0_8_ = bottom_blob;
  _elemsize = bottom_blob->elemsize;
  iVar40 = this->kernel_w;
  iVar43 = this->dilation_w;
  iVar2 = this->kernel_h;
  iVar3 = this->stride_w;
  iVar4 = this->dilation_h;
  iVar16 = this->stride_h;
  iVar19 = this->output_pad_right;
  iVar20 = this->output_pad_bottom;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  auVar34._0_4_ = -(uint)(0 < this->pad_left);
  auVar34._4_4_ = -(uint)(0 < this->pad_right);
  auVar34._8_4_ = -(uint)(0 < this->pad_top);
  auVar34._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar15 = movmskps((int)&local_198 + 0x28,auVar34);
  lVar30 = 0x10;
  if ((iVar15 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar30 = 8, &local_198 != top_blob)))) {
    piVar6 = top_blob->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_198.data = top_blob->data;
    local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_198.elemsize = top_blob->elemsize;
    local_198.elempack = top_blob->elempack;
    local_198.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_198.c = top_blob->c;
    local_198.cstep = top_blob->cstep;
    local_198.dims = uVar10;
    local_198.w = uVar11;
    local_198.h = uVar12;
    local_198.d = uVar13;
  }
  local_148 = top_blob;
  local_b8 = opt;
  Mat::create(&local_198,iVar19 + (iVar40 + -1) * iVar43 + (iVar23 + -1) * iVar3 + 1,
              iVar20 + 1 + (iVar2 + -1) * iVar4 + (iVar24 + -1) * iVar16,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar30));
  iVar24 = local_198.c;
  iVar23 = local_198.w;
  iVar40 = -100;
  if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
    iVar40 = this->kernel_w;
    iVar43 = this->kernel_h;
    local_98 = (long)this->stride_w;
    local_128._0_8_ = (long)this->stride_h;
    iVar2 = this->dilation_w;
    iVar3 = this->dilation_h;
    local_140 = (ulong)(uint)this->group;
    local_1c0 = (ulong)(uint)this->activation_type;
    iVar4 = *(int *)(local_d8._0_8_ + 0x38);
    uVar21 = iVar40 * iVar43;
    __n = (size_type)(int)uVar21;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1c9);
    if (0 < iVar43) {
      iVar16 = 0;
      iVar19 = 0;
      iVar20 = 0;
      do {
        if (0 < iVar40) {
          lVar30 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar16 + lVar30] = iVar19;
            iVar19 = iVar19 + iVar2;
            lVar30 = lVar30 + 1;
          } while (iVar40 != (int)lVar30);
          iVar16 = iVar16 + (int)lVar30;
        }
        iVar19 = iVar19 + (iVar23 * iVar3 - iVar2 * iVar40);
        iVar20 = iVar20 + 1;
      } while (iVar20 != iVar43);
    }
    iVar23 = (int)local_140;
    if (iVar24 == iVar23 && iVar4 == iVar23) {
      if (0 < iVar23) {
        local_f8 = *(long *)local_d8._0_8_;
        local_100 = *(long *)(local_d8._0_8_ + 0x10) * *(long *)(local_d8._0_8_ + 0x40);
        pvVar31 = (this->weight_data).data;
        local_108 = (this->bias_data).data;
        local_1a0 = local_198.data;
        local_1c8 = local_198.cstep * local_198.elemsize;
        lVar30 = (long)local_198.h * (long)local_198.w;
        local_1b0 = 0;
        iVar23 = (int)((local_198.elemsize * lVar30 + 0xf & 0xfffffffffffffff0) / local_198.elemsize
                      );
        if (local_198.dims == 4) {
          iVar23 = (int)lVar30;
        }
        local_130 = (ulong)(uint)(iVar23 * local_198.d);
        uVar17 = *(uint *)(local_d8._0_8_ + 0x2c);
        uVar5 = *(uint *)(local_d8._0_8_ + 0x30);
        local_1a8 = (ulong)(uint)(local_198.h * local_198.w);
        local_f0 = (void *)CONCAT71(local_f0._1_7_,
                                    (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                                    local_108 == (void *)0x0);
        lVar22 = local_128._0_8_ * (long)local_198.w * local_198.elemsize;
        lVar30 = local_130 - 1;
        local_138 = (ulong)(iVar23 * local_198.d + 3U & 0xfffffffc);
        auVar39._8_4_ = (int)lVar30;
        auVar39._0_8_ = lVar30;
        auVar39._12_4_ = (int)((ulong)lVar30 >> 0x20);
        auVar39 = auVar39 ^ _DAT_0054e6f0;
        local_1b8 = (void *)((long)local_198.data + 0xc);
        local_128._0_8_ = lVar22;
        pvVar25 = local_198.data;
        auVar34 = _DAT_0054e7f0;
        auVar41 = _DAT_0054e800;
        auVar42 = _DAT_0054e6f0;
        local_c8 = auVar39;
        do {
          uVar32 = 0;
          if ((char)local_f0 == '\0') {
            uVar32 = *(undefined4 *)((long)local_108 + local_1b0 * 4);
          }
          if (0 < (int)local_130) {
            uVar18 = 0;
            do {
              auVar36._8_4_ = (int)uVar18;
              auVar36._0_8_ = uVar18;
              auVar36._12_4_ = (int)(uVar18 >> 0x20);
              auVar35 = (auVar36 | auVar41) ^ auVar42;
              iVar24 = auVar39._0_4_;
              bVar9 = iVar24 < auVar35._0_4_;
              iVar23 = auVar35._4_4_;
              iVar40 = auVar39._4_4_;
              if ((bool)(~(iVar40 < iVar23 || iVar23 == iVar40 && bVar9) & 1)) {
                *(undefined4 *)((long)local_1b8 + uVar18 * 4 + -0xc) = uVar32;
              }
              if (iVar40 >= iVar23 && (iVar23 != iVar40 || !bVar9)) {
                *(undefined4 *)((long)local_1b8 + uVar18 * 4 + -8) = uVar32;
              }
              auVar35 = (auVar36 | auVar34) ^ auVar42;
              iVar23 = auVar35._4_4_;
              if (iVar23 <= iVar40 && (iVar23 != iVar40 || auVar35._0_4_ <= iVar24)) {
                *(undefined4 *)((long)local_1b8 + uVar18 * 4 + -4) = uVar32;
                *(undefined4 *)((long)local_1b8 + uVar18 * 4) = uVar32;
              }
              uVar18 = uVar18 + 4;
            } while (local_138 != uVar18);
          }
          if (0 < (int)uVar5) {
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar26 = 0;
                do {
                  if (0 < (int)uVar21) {
                    lVar30 = uVar26 * local_98 * 4 + lVar22 * uVar18 + local_1c8 * local_1b0;
                    fVar33 = *(float *)(local_100 * local_1b0 + local_f8 +
                                        uVar18 * (long)(int)uVar17 * 4 + uVar26 * 4);
                    uVar28 = 0;
                    do {
                      *(float *)((long)local_1a0 +
                                (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar28] * 4 + lVar30) =
                           *(float *)((long)pvVar31 + uVar28 * 4) * fVar33 +
                           *(float *)((long)local_1a0 +
                                     (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar28] * 4 +
                                     lVar30);
                      uVar28 = uVar28 + 1;
                    } while (uVar21 != uVar28);
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar17);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar5);
          }
          if (0 < (int)local_1a8) {
            pfVar7 = (float *)(this->activation_params).data;
            uVar28 = 0;
            uVar18 = local_1c0;
            uVar26 = local_1a8;
            do {
              fVar33 = *(float *)((long)pvVar25 + uVar28 * 4);
              fVar38 = fVar33;
              switch((int)uVar18) {
              case 1:
                if (fVar33 <= 0.0) {
                  fVar38 = 0.0;
                }
                break;
              case 2:
                fVar38 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar7 |
                                -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                break;
              case 3:
                if (fVar33 <= *pfVar7) {
                  fVar33 = *pfVar7;
                }
                fVar38 = pfVar7[1];
                if (fVar33 <= pfVar7[1]) {
                  fVar38 = fVar33;
                }
                break;
              case 4:
                if (88.37626 <= fVar33) {
                  fVar33 = 88.37626;
                }
                fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar33 < -88.37626) & ((uint)fVar33 ^ auVar42._0_4_)))
                ;
                uVar18 = local_1c0;
                uVar26 = local_1a8;
                auVar39 = local_c8;
                auVar34 = _DAT_0054e7f0;
                auVar41 = _DAT_0054e800;
                auVar42 = _DAT_0054e6f0;
                fVar38 = 1.0 / (fVar33 + 1.0);
                break;
              case 5:
                local_d8 = ZEXT416((uint)fVar33);
                fVar33 = expf(fVar33);
                fVar33 = logf(fVar33 + 1.0);
                fVar33 = tanhf(fVar33);
                uVar18 = local_1c0;
                uVar26 = local_1a8;
                auVar39 = local_c8;
                auVar34 = _DAT_0054e7f0;
                auVar41 = _DAT_0054e800;
                auVar42 = _DAT_0054e6f0;
                fVar38 = fVar33 * (float)local_d8._0_4_;
                break;
              case 6:
                fVar1 = *pfVar7;
                fVar37 = (float)((uint)pfVar7[1] ^ auVar42._0_4_) / fVar1;
                fVar38 = 0.0;
                if ((fVar37 <= fVar33) && (fVar38 = fVar33, fVar33 <= fVar37 + 1.0 / fVar1)) {
                  fVar38 = (fVar1 * fVar33 + pfVar7[1]) * fVar33;
                }
              }
              *(float *)((long)pvVar25 + uVar28 * 4) = fVar38;
              uVar28 = uVar28 + 1;
            } while (uVar26 != uVar28);
          }
          local_1b0 = local_1b0 + 1;
          local_1b8 = (void *)((long)local_1b8 + local_1c8);
          pvVar31 = (void *)((long)pvVar31 + __n * 4);
          pvVar25 = (void *)((long)pvVar25 + local_1c8);
          lVar22 = local_128._0_8_;
        } while (local_1b0 != local_140);
      }
    }
    else {
      uVar17 = iVar4 / iVar23;
      if (0 < iVar23) {
        uVar18 = (long)iVar24 / (long)iVar23;
        local_1a0 = (void *)(uVar18 & 0xffffffff);
        local_e0 = local_198.d;
        local_138 = local_198.cstep * local_198.elemsize;
        local_78 = (long)local_198.h * (long)local_198.w;
        local_80 = local_198.elemsize * local_78 + 0xf & 0xfffffffffffffff0;
        local_e4 = local_198.dims;
        local_1c8 = (ulong)(uint)(local_198.h * local_198.w);
        local_dc = (int)uVar18;
        local_88 = (long)local_dc;
        local_70 = local_198.elemsize;
        local_1b0 = (long)local_198.w * local_198.elemsize * local_128._0_8_;
        local_dc = local_dc * iVar40 * iVar43 * uVar17;
        local_68 = local_138 * local_88;
        local_58 = (long)(int)(uVar17 * uVar21) << 2;
        local_90 = (this->weight_data).data;
        local_a0 = (this->bias_data).data;
        uVar5 = *(uint *)(local_d8._0_8_ + 0x2c);
        local_1a8 = (ulong)*(uint *)(local_d8._0_8_ + 0x30);
        local_a8 = (long)local_198.data + 0xc;
        local_110 = 0;
        local_60 = local_198.data;
        local_b0 = local_198.data;
        local_118 = 0;
        auVar34 = _DAT_0054e7f0;
        auVar39 = _DAT_0054e800;
        auVar41 = _DAT_0054e6f0;
        do {
          if (0 < (int)local_1a0) {
            local_1e0 = (void *)((long)local_90 + (long)(int)local_110 * 4);
            local_f8 = local_118 * local_88;
            iVar23 = (int)local_78;
            if (local_e4 != 4) {
              iVar23 = (int)(local_80 / local_70);
            }
            local_108 = (void *)(ulong)(uint)(iVar23 * local_e0);
            iVar24 = (int)local_118;
            local_100 = CONCAT71(local_100._1_7_,
                                 (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                                 local_a0 == (void *)0x0);
            local_50 = (ulong)(iVar23 * local_e0 + 3U & 0xfffffffc);
            lVar30 = (long)local_108 - 1;
            auVar42._8_4_ = (int)lVar30;
            auVar42._0_8_ = lVar30;
            auVar42._12_4_ = (int)((ulong)lVar30 >> 0x20);
            auVar42 = auVar42 ^ auVar41;
            local_130 = local_a8;
            pvVar25 = (void *)0x0;
            pvVar31 = local_b0;
            local_128 = auVar42;
            do {
              uVar32 = 0;
              if ((char)local_100 == '\0') {
                uVar32 = *(undefined4 *)((long)local_a0 + ((long)pvVar25 + local_f8) * 4);
              }
              if (0 < (int)local_108) {
                uVar18 = 0;
                do {
                  auVar35._8_4_ = (int)uVar18;
                  auVar35._0_8_ = uVar18;
                  auVar35._12_4_ = (int)(uVar18 >> 0x20);
                  auVar36 = (auVar35 | auVar39) ^ auVar41;
                  iVar40 = auVar42._0_4_;
                  bVar9 = iVar40 < auVar36._0_4_;
                  iVar23 = auVar36._4_4_;
                  iVar43 = auVar42._4_4_;
                  if ((bool)(~(iVar43 < iVar23 || iVar23 == iVar43 && bVar9) & 1)) {
                    *(undefined4 *)((local_130 - 0xc) + uVar18 * 4) = uVar32;
                  }
                  if (iVar43 >= iVar23 && (iVar23 != iVar43 || !bVar9)) {
                    *(undefined4 *)((local_130 - 8) + uVar18 * 4) = uVar32;
                  }
                  auVar35 = (auVar35 | auVar34) ^ auVar41;
                  iVar23 = auVar35._4_4_;
                  if (iVar23 <= iVar43 && (iVar23 != iVar43 || auVar35._0_4_ <= iVar40)) {
                    *(undefined4 *)((local_130 - 4) + uVar18 * 4) = uVar32;
                    *(undefined4 *)(local_130 + uVar18 * 4) = uVar32;
                  }
                  uVar18 = uVar18 + 4;
                } while (local_50 != uVar18);
              }
              if (0 < (int)local_1a8) {
                pvVar27 = (void *)(((long)pvVar25 + local_f8) * local_138 + (long)local_60);
                local_c8._0_8_ = pvVar27;
                local_1f0 = 0;
                do {
                  if (0 < (int)uVar5) {
                    iVar23 = *(int *)(local_d8._0_8_ + 0x2c);
                    lVar30 = *(long *)(local_d8._0_8_ + 0x10);
                    lVar22 = *(long *)(local_d8._0_8_ + 0x40);
                    lVar8 = *(long *)local_d8._0_8_;
                    uVar18 = 0;
                    do {
                      if (0 < (int)uVar17) {
                        lVar14 = uVar18 * local_98 * 4 + local_1b0 * local_1f0;
                        uVar26 = 0;
                        pvVar29 = local_1e0;
                        do {
                          if (0 < (int)uVar21) {
                            fVar33 = *(float *)((long)iVar23 * local_1f0 * lVar30 + lVar8 +
                                                uVar18 * 4 +
                                               (uVar26 + uVar17 * iVar24) * lVar22 * lVar30);
                            uVar28 = 0;
                            do {
                              *(float *)((long)pvVar27 +
                                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar28] * 4
                                        + lVar14) =
                                   *(float *)((long)pvVar29 + uVar28 * 4) * fVar33 +
                                   *(float *)((long)pvVar27 +
                                             (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar28] *
                                             4 + lVar14);
                              uVar28 = uVar28 + 1;
                            } while (uVar21 != uVar28);
                          }
                          uVar26 = uVar26 + 1;
                          pvVar29 = (void *)((long)pvVar29 + __n * 4);
                        } while (uVar26 != uVar17);
                      }
                      uVar18 = uVar18 + 1;
                    } while (uVar18 != uVar5);
                  }
                  local_1f0 = local_1f0 + 1;
                } while (local_1f0 != local_1a8);
              }
              local_1b8 = pvVar31;
              local_f0 = pvVar25;
              if (0 < (int)local_1c8) {
                pfVar7 = (float *)(this->activation_params).data;
                uVar28 = 0;
                uVar18 = local_1c0;
                uVar26 = local_1c8;
                do {
                  fVar33 = *(float *)((long)pvVar31 + uVar28 * 4);
                  fVar38 = fVar33;
                  switch((int)uVar18) {
                  case 1:
                    if (fVar33 <= 0.0) {
                      fVar38 = 0.0;
                    }
                    break;
                  case 2:
                    fVar38 = (float)(~-(uint)(0.0 < fVar33) & (uint)*pfVar7 |
                                    -(uint)(0.0 < fVar33) & 0x3f800000) * fVar33;
                    break;
                  case 3:
                    if (fVar33 <= *pfVar7) {
                      fVar33 = *pfVar7;
                    }
                    fVar38 = pfVar7[1];
                    if (fVar33 <= pfVar7[1]) {
                      fVar38 = fVar33;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar33) {
                      fVar33 = 88.37626;
                    }
                    fVar33 = expf((float)(-(uint)(fVar33 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar33 < -88.37626) &
                                         ((uint)fVar33 ^ auVar41._0_4_)));
                    uVar18 = local_1c0;
                    pvVar31 = local_1b8;
                    uVar26 = local_1c8;
                    auVar34 = _DAT_0054e7f0;
                    auVar39 = _DAT_0054e800;
                    auVar41 = _DAT_0054e6f0;
                    auVar42 = local_128;
                    fVar38 = 1.0 / (fVar33 + 1.0);
                    break;
                  case 5:
                    local_c8 = ZEXT416((uint)fVar33);
                    fVar33 = expf(fVar33);
                    fVar33 = logf(fVar33 + 1.0);
                    fVar33 = tanhf(fVar33);
                    uVar18 = local_1c0;
                    pvVar31 = local_1b8;
                    uVar26 = local_1c8;
                    auVar34 = _DAT_0054e7f0;
                    auVar39 = _DAT_0054e800;
                    auVar41 = _DAT_0054e6f0;
                    auVar42 = local_128;
                    fVar38 = fVar33 * (float)local_c8._0_4_;
                    break;
                  case 6:
                    fVar1 = *pfVar7;
                    fVar37 = (float)((uint)pfVar7[1] ^ auVar41._0_4_) / fVar1;
                    fVar38 = 0.0;
                    if ((fVar37 <= fVar33) && (fVar38 = fVar33, fVar33 <= fVar37 + 1.0 / fVar1)) {
                      fVar38 = (fVar1 * fVar33 + pfVar7[1]) * fVar33;
                    }
                  }
                  *(float *)((long)pvVar31 + uVar28 * 4) = fVar38;
                  uVar28 = uVar28 + 1;
                } while (uVar26 != uVar28);
              }
              pvVar25 = (void *)((long)local_f0 + 1);
              local_130 = local_130 + local_138;
              local_1e0 = (void *)((long)local_1e0 + local_58);
              pvVar31 = (void *)((long)pvVar31 + local_138);
            } while (pvVar25 != local_1a0);
          }
          local_118 = local_118 + 1;
          local_a8 = local_a8 + local_68;
          local_110 = (ulong)(uint)((int)local_110 + local_dc);
          local_b0 = (void *)((long)local_b0 + local_68);
        } while (local_118 != local_140);
      }
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cut_padding(this,&local_198,local_148,local_b8);
    iVar40 = -100;
    if ((local_148->data != (void *)0x0) &&
       (iVar40 = -100, (long)local_148->c * local_148->cstep != 0)) {
      iVar40 = 0;
    }
  }
  piVar6 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}